

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
InitializeSlots<std::allocator<char>,184ul,false,false,8ul>
          (HashSetResizeHelper *this,CommonFields *c,allocator<char> *param_3)

{
  ulong uVar1;
  ctrl_t *__s;
  void *pvVar2;
  size_t sVar3;
  RawHashSetLayout layout;
  
  sVar3 = c->capacity_;
  if (sVar3 != 0) {
    if (this->old_capacity_ != 0) {
      CommonFields::infoz(c);
      sVar3 = c->capacity_;
    }
    RawHashSetLayout::RawHashSetLayout(&layout,sVar3,8,false);
    pvVar2 = Allocate<8ul,std::allocator<char>>
                       (param_3,layout.capacity_ * 0xb8 + layout.slot_offset_);
    (c->heap_or_soo_).heap.control = (ctrl_t *)(layout.control_offset_ + (long)pvVar2);
    (c->heap_or_soo_).heap.slot_array.p = (void *)((long)pvVar2 + layout.slot_offset_);
    ResetGrowthLeft(c);
    uVar1 = this->old_capacity_;
    if (uVar1 == 0 || (uVar1 >= layout.capacity_ || layout.capacity_ >= 0x11)) {
      sVar3 = c->capacity_;
      __s = (c->heap_or_soo_).heap.control;
      memset(__s,0x80,sVar3 + 0x10);
      __s[sVar3] = kSentinel;
    }
    else {
      absl::lts_20240722::container_internal::HashSetResizeHelper::
      GrowIntoSingleGroupShuffleControlBytes((ctrl_t *)this,(ulong)(c->heap_or_soo_).heap.control);
    }
    *(byte *)&c->size_ = (byte)c->size_ & 0xfe;
    return uVar1 < layout.capacity_ && layout.capacity_ < 0x11;
  }
  __assert_fail("c.capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x7f5,
                "bool absl::container_internal::HashSetResizeHelper::InitializeSlots(CommonFields &, Alloc, ctrl_t, size_t, size_t) [Alloc = std::allocator<char>, SizeOfSlot = 184UL, TransferUsesMemcpy = false, SooEnabled = false, AlignOfSlot = 8UL]"
               );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool InitializeSlots(CommonFields& c, Alloc alloc,
                                               ctrl_t soo_slot_h2,
                                               size_t key_size,
                                               size_t value_size) {
    assert(c.capacity());
    HashtablezInfoHandle infoz =
        ShouldSampleHashtablezInfo<Alloc>()
            ? SampleHashtablezInfo<SooEnabled>(SizeOfSlot, key_size, value_size,
                                               old_capacity_, was_soo_,
                                               forced_infoz_, c)
            : HashtablezInfoHandle{};

    const bool has_infoz = infoz.IsSampled();
    RawHashSetLayout layout(c.capacity(), AlignOfSlot, has_infoz);
    char* mem = static_cast<char*>(Allocate<BackingArrayAlignment(AlignOfSlot)>(
        &alloc, layout.alloc_size(SizeOfSlot)));
    const GenerationType old_generation = c.generation();
    c.set_generation_ptr(
        reinterpret_cast<GenerationType*>(mem + layout.generation_offset()));
    c.set_generation(NextGeneration(old_generation));
    c.set_control(reinterpret_cast<ctrl_t*>(mem + layout.control_offset()));
    c.set_slots(mem + layout.slot_offset());
    ResetGrowthLeft(c);

    const bool grow_single_group =
        IsGrowingIntoSingleGroupApplicable(old_capacity_, layout.capacity());
    if (SooEnabled && was_soo_ && grow_single_group) {
      InitControlBytesAfterSoo(c.control(), soo_slot_h2, layout.capacity());
      if (TransferUsesMemcpy && had_soo_slot_) {
        TransferSlotAfterSoo(c, SizeOfSlot);
      }
      // SooEnabled implies that old_capacity_ != 0.
    } else if ((SooEnabled || old_capacity_ != 0) && grow_single_group) {
      if (TransferUsesMemcpy) {
        GrowSizeIntoSingleGroupTransferable(c, SizeOfSlot);
        DeallocateOld<AlignOfSlot>(alloc, SizeOfSlot);
      } else {
        GrowIntoSingleGroupShuffleControlBytes(c.control(), layout.capacity());
      }
    } else {
      ResetCtrl(c, SizeOfSlot);
    }

    c.set_has_infoz(has_infoz);
    if (has_infoz) {
      infoz.RecordStorageChanged(c.size(), layout.capacity());
      if ((SooEnabled && was_soo_) || grow_single_group || old_capacity_ == 0) {
        infoz.RecordRehash(0);
      }
      c.set_infoz(infoz);
    }
    return grow_single_group;
  }